

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Document::parseTAGDirective(Document *this)

{
  size_type sVar1;
  mapped_type *pmVar2;
  StringRef SVar3;
  StringRef local_100;
  StringRef local_f0;
  char *local_e0;
  StringRef TagPrefix;
  StringRef TagHandle;
  size_t HandleEnd;
  StringRef local_88;
  StringRef local_78;
  StringRef local_68;
  undefined1 auStack_58 [8];
  StringRef T;
  Token Tag;
  Document *this_local;
  
  getNext((Token *)&T.Length,this);
  StringRef::StringRef(&local_88," \t");
  sVar1 = StringRef::find_first_of((StringRef *)auStack_58,local_88,0);
  local_78 = StringRef::substr((StringRef *)auStack_58,sVar1,0xffffffffffffffff);
  StringRef::StringRef((StringRef *)&HandleEnd," \t");
  local_68 = StringRef::ltrim(&local_78,_HandleEnd);
  T.Data = (char *)local_68.Length;
  auStack_58 = (undefined1  [8])local_68.Data;
  StringRef::StringRef((StringRef *)&TagHandle.Length," \t");
  sVar1 = StringRef::find_first_of((StringRef *)auStack_58,stack0xffffffffffffff40,0);
  SVar3 = StringRef::substr((StringRef *)auStack_58,0,sVar1);
  TagHandle.Data = (char *)SVar3.Length;
  TagPrefix.Length = (size_t)SVar3.Data;
  local_f0 = StringRef::substr((StringRef *)auStack_58,sVar1,0xffffffffffffffff);
  StringRef::StringRef(&local_100," \t");
  SVar3 = StringRef::ltrim(&local_f0,local_100);
  TagPrefix.Data = (char *)SVar3.Length;
  local_e0 = SVar3.Data;
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,(key_type *)&TagPrefix.Length);
  pmVar2->Data = local_e0;
  pmVar2->Length = (size_t)TagPrefix.Data;
  Token::~Token((Token *)&T.Length);
  return;
}

Assistant:

void Document::parseTAGDirective() {
  Token Tag = getNext(); // %TAG <handle> <prefix>
  StringRef T = Tag.Range;
  // Strip %TAG
  T = T.substr(T.find_first_of(" \t")).ltrim(" \t");
  std::size_t HandleEnd = T.find_first_of(" \t");
  StringRef TagHandle = T.substr(0, HandleEnd);
  StringRef TagPrefix = T.substr(HandleEnd).ltrim(" \t");
  TagMap[TagHandle] = TagPrefix;
}